

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

uint add_list_to_class(uint8_t *classbits,PCRE2_UCHAR16 **uchardptr,uint32_t options,
                      compile_block_16 *cb,uint32_t *p,uint except)

{
  uint uVar1;
  uint local_3c;
  uint local_38;
  uint n;
  uint n8;
  uint except_local;
  uint32_t *p_local;
  compile_block_16 *cb_local;
  uint32_t options_local;
  PCRE2_UCHAR16 **uchardptr_local;
  uint8_t *classbits_local;
  
  local_38 = 0;
  for (_n8 = p; *_n8 != 0xffffffff; _n8 = _n8 + (local_3c + 1)) {
    local_3c = 0;
    if (*_n8 != except) {
      for (; _n8[local_3c + 1] == *_n8 + local_3c + 1; local_3c = local_3c + 1) {
      }
      cb->class_range_start = *_n8;
      cb->class_range_end = _n8[local_3c];
      uVar1 = add_to_class_internal(classbits,uchardptr,options,cb,*_n8,_n8[local_3c]);
      local_38 = uVar1 + local_38;
    }
  }
  return local_38;
}

Assistant:

static unsigned int
add_list_to_class(uint8_t *classbits, PCRE2_UCHAR **uchardptr, uint32_t options,
  compile_block *cb, const uint32_t *p, unsigned int except)
{
unsigned int n8 = 0;
while (p[0] < NOTACHAR)
  {
  unsigned int n = 0;
  if (p[0] != except)
    {
    while(p[n+1] == p[0] + n + 1) n++;
    cb->class_range_start = p[0];
    cb->class_range_end = p[n];
    n8 += add_to_class_internal(classbits, uchardptr, options, cb, p[0], p[n]);
    }
  p += n + 1;
  }
return n8;
}